

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_fma.cpp
# Opt level: O0

void ncnn::binary_op_vector_no_broadcast<ncnn::BinaryOp_x86_fma_functor::binary_op_div>
               (float *ptr,float *ptr1,float *outptr,int size)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  int in_ECX;
  float *in_RDX;
  undefined1 (*in_RSI) [32];
  undefined1 (*in_RDI) [32];
  __m128 _outp_1;
  __m128 _b_1;
  __m128 _p_1;
  __m256 _outp;
  __m256 _b;
  __m256 _p;
  int i;
  binary_op_div op;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  int local_174;
  float *local_168;
  undefined1 (*local_160) [32];
  undefined1 (*local_158) [32];
  
  local_168 = in_RDX;
  local_160 = in_RSI;
  local_158 = in_RDI;
  for (local_174 = 0; local_174 + 7 < in_ECX; local_174 = local_174 + 8) {
    auVar2 = vdivps_avx(*local_158,*local_160);
    local_1e0 = auVar2._0_8_;
    uStack_1d8 = auVar2._8_8_;
    uStack_1d0 = auVar2._16_8_;
    uStack_1c8 = auVar2._24_8_;
    *(undefined8 *)local_168 = local_1e0;
    *(undefined8 *)(local_168 + 2) = uStack_1d8;
    *(undefined8 *)(local_168 + 4) = uStack_1d0;
    *(undefined8 *)(local_168 + 6) = uStack_1c8;
    local_158 = local_158 + 1;
    local_160 = local_160 + 1;
    local_168 = local_168 + 8;
  }
  for (; local_174 + 3 < in_ECX; local_174 = local_174 + 4) {
    auVar1 = vdivps_avx(*(undefined1 (*) [16])*local_158,*(undefined1 (*) [16])*local_160);
    local_210 = auVar1._0_8_;
    uStack_208 = auVar1._8_8_;
    *(undefined8 *)local_168 = local_210;
    *(undefined8 *)(local_168 + 2) = uStack_208;
    local_158 = (undefined1 (*) [32])(*local_158 + 0x10);
    local_160 = (undefined1 (*) [32])(*local_160 + 0x10);
    local_168 = local_168 + 4;
  }
  for (; local_174 < in_ECX; local_174 = local_174 + 1) {
    *local_168 = *(float *)*local_158 / *(float *)*local_160;
    local_158 = (undefined1 (*) [32])(*local_158 + 4);
    local_160 = (undefined1 (*) [32])(*local_160 + 4);
    local_168 = local_168 + 1;
  }
  return;
}

Assistant:

static void binary_op_vector_no_broadcast(const float* ptr, const float* ptr1, float* outptr, int size)
{
    const Op op;

    int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
    for (; i + 15 < size; i += 16)
    {
        __m512 _p = _mm512_loadu_ps(ptr);
        __m512 _b = _mm512_loadu_ps(ptr1);
        __m512 _outp = op.func_pack16(_p, _b);
        _mm512_storeu_ps(outptr, _outp);
        ptr += 16;
        ptr1 += 16;
        outptr += 16;
    }
#endif // __AVX512F__
    for (; i + 7 < size; i += 8)
    {
        __m256 _p = _mm256_loadu_ps(ptr);
        __m256 _b = _mm256_loadu_ps(ptr1);
        __m256 _outp = op.func_pack8(_p, _b);
        _mm256_storeu_ps(outptr, _outp);
        ptr += 8;
        ptr1 += 8;
        outptr += 8;
    }
#endif // __AVX__
    for (; i + 3 < size; i += 4)
    {
        __m128 _p = _mm_loadu_ps(ptr);
        __m128 _b = _mm_loadu_ps(ptr1);
        __m128 _outp = op.func_pack4(_p, _b);
        _mm_storeu_ps(outptr, _outp);
        ptr += 4;
        ptr1 += 4;
        outptr += 4;
    }
#endif // __SSE2__
    for (; i < size; i++)
    {
        *outptr = op.func(*ptr, *ptr1);
        ptr += 1;
        ptr1 += 1;
        outptr += 1;
    }
}